

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midimixup.cpp
# Opt level: O2

void checkOptions(Options *opts)

{
  bool bVar1;
  ostream *poVar2;
  string *__return_storage_ptr__;
  allocator local_5a;
  allocator local_59;
  string local_58;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_58,"r|reverse=b",&local_59);
  std::__cxx11::string::string((string *)&local_38,"Reverse the order of notes",&local_5a);
  smf::Options::define(opts,&local_58,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string((string *)&local_58,"author=b",&local_59);
  std::__cxx11::string::string((string *)&local_38,"Author of the program",&local_5a);
  smf::Options::define(opts,&local_58,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string((string *)&local_58,"version=b",&local_59);
  std::__cxx11::string::string((string *)&local_38,"Print version of the program",&local_5a);
  smf::Options::define(opts,&local_58,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string((string *)&local_58,"example=b",&local_59);
  std::__cxx11::string::string((string *)&local_38,"Display example use of the program",&local_5a);
  smf::Options::define(opts,&local_58,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string((string *)&local_58,"help=b",&local_59);
  std::__cxx11::string::string((string *)&local_38,"Dispay help for the program",&local_5a);
  smf::Options::define(opts,&local_58,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  smf::Options::process(opts,1,0);
  std::__cxx11::string::string((string *)&local_58,"author",(allocator *)&local_38);
  bVar1 = smf::Options::getBoolean(opts,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Written by Craig Stuart Sapp, ");
    poVar2 = std::operator<<(poVar2,"craig@ccrma.stanford.edu, 2 December 1999");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  else {
    std::__cxx11::string::string((string *)&local_58,"version",(allocator *)&local_38);
    bVar1 = smf::Options::getBoolean(opts,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cout,"midimixup version 2.0");
      std::endl<char,std::char_traits<char>>(poVar2);
      poVar2 = std::operator<<((ostream *)&std::cout,"compiled: ");
      poVar2 = std::operator<<(poVar2,"Apr 26 2025");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    std::__cxx11::string::string((string *)&local_58,"help",(allocator *)&local_38);
    bVar1 = smf::Options::getBoolean(opts,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    if (bVar1) {
      __return_storage_ptr__ = &local_58;
      smf::Options::getCommand_abi_cxx11_(__return_storage_ptr__,opts);
      usage((char *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_58);
    }
    else {
      std::__cxx11::string::string((string *)&local_58,"example",(allocator *)&local_38);
      bVar1 = smf::Options::getBoolean(opts,&local_58);
      std::__cxx11::string::~string((string *)&local_58);
      if (!bVar1) {
        std::__cxx11::string::string((string *)&local_58,"reverse",(allocator *)&local_38);
        bVar1 = smf::Options::getBoolean(opts,&local_58);
        reverseQ = (int)bVar1;
        std::__cxx11::string::~string((string *)&local_58);
        return;
      }
      example();
    }
  }
  exit(0);
}

Assistant:

void checkOptions(Options& opts) {
	opts.define("r|reverse=b", "Reverse the order of notes");

	opts.define("author=b",    "Author of the program");
	opts.define("version=b",   "Print version of the program");
	opts.define("example=b",   "Display example use of the program");
	opts.define("help=b",      "Dispay help for the program");
	opts.process();

	if (opts.getBoolean("author")) {
		cout << "Written by Craig Stuart Sapp, "
			  << "craig@ccrma.stanford.edu, 2 December 1999" << endl;
		exit(0);
	}
	if (opts.getBoolean("version")) {
		cout << "midimixup version 2.0" << endl;
		cout << "compiled: " << __DATE__ << endl;
	}
	if (opts.getBoolean("help")) {
		usage(opts.getCommand().c_str());
		exit(0);
	}
	if (opts.getBoolean("example")) {
		example();
		exit(0);
	}

	reverseQ = opts.getBoolean("reverse");
}